

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O0

void __thiscall PrintLanguage::recurse(PrintLanguage *this)

{
  uint4 uVar1;
  int iVar2;
  Varnode *this_00;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  PcodeOp *pPVar6;
  PcodeOp *op;
  Varnode *vn;
  int4 final;
  uint4 modsave;
  PrintLanguage *this_local;
  
  uVar1 = this->mods;
  iVar2 = this->pending;
  sVar4 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::size
                    (&this->nodepend);
  this->pending = (int4)sVar4;
  while (iVar2 < this->pending) {
    pvVar5 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::
             back(&this->nodepend);
    this_00 = pvVar5->vn;
    pvVar5 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::
             back(&this->nodepend);
    pPVar6 = pvVar5->op;
    pvVar5 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::
             back(&this->nodepend);
    this->mods = pvVar5->vnmod;
    std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::pop_back
              (&this->nodepend);
    this->pending = this->pending + -1;
    bVar3 = Varnode::isImplied(this_00);
    if (bVar3) {
      pPVar6 = Varnode::getDef(this_00);
      PcodeOp::push(pPVar6,this);
    }
    else {
      pushVnExplicit(this,this_00,pPVar6);
    }
    sVar4 = std::vector<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>::
            size(&this->nodepend);
    this->pending = (int4)sVar4;
  }
  this->mods = uVar1;
  return;
}

Assistant:

void PrintLanguage::recurse(void)

{
  uint4 modsave = mods;
  int4 final = pending;		// Already claimed
  pending = nodepend.size();	// Lay claim to the rest
  while(final < pending) {
    const Varnode *vn = nodepend.back().vn;
    const PcodeOp *op = nodepend.back().op;
    mods = nodepend.back().vnmod;
    nodepend.pop_back();
    pending -= 1;
    if (vn->isImplied())
      vn->getDef()->push(this);
    else
      pushVnExplicit(vn,op);
    pending = nodepend.size();
  }
  mods = modsave;
}